

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
* wallet::GetAddressBalances
            (map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
             *__return_storage_ptr__,CWallet *wallet)

{
  _Rb_tree_header *p_Var1;
  CWalletTx *wtx;
  CTxOut *txout;
  bool bVar2;
  int iVar3;
  isminetype iVar4;
  CAmount CVar5;
  _Hash_node_base *p_Var6;
  mapped_type_conflict1 *pmVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  _Hash_node_base *p_Var11;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CTxDestination addr;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  unique_lock<std::recursive_mutex> local_f8;
  _Hash_node_base *local_e8;
  _Hash_node_base *p_Stack_e0;
  _Hash_node_base *local_d8;
  _Hash_node_base *p_Stack_d0;
  uint32_t local_c8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_b8;
  undefined1 local_70;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_f8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_f8);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var11 = (wallet->mapWallet)._M_h._M_before_begin._M_nxt; p_Var11 != (_Hash_node_base *)0x0;
      p_Var11 = p_Var11->_M_nxt) {
    wtx = (CWalletTx *)(p_Var11 + 5);
    bVar2 = CachedTxIsTrusted(wallet,wtx,
                              (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                              &local_68);
    if (bVar2) {
      bVar2 = CWallet::IsTxImmatureCoinBase(wallet,wtx);
      if (!bVar2) {
        iVar3 = CWallet::GetTxDepthInMainChain(wallet,wtx);
        local_b8._0_4_ = 3;
        CVar5 = CachedTxGetDebit(wallet,wtx,(isminefilter *)&local_b8);
        if ((int)(uint)(CVar5 < 1) <= iVar3) {
          p_Var6 = p_Var11[0x38]._M_nxt[3]._M_nxt;
          if (p_Var11[0x38]._M_nxt[4]._M_nxt != p_Var6) {
            uVar10 = 1;
            uVar8 = 0;
            do {
              txout = (CTxOut *)(p_Var6 + uVar8 * 5);
              local_b8._16_8_ = 0;
              local_b8._24_8_ = 0;
              local_b8._0_8_ = 0;
              local_b8._8_8_ = 0;
              local_70 = 0;
              iVar4 = CWallet::IsMine(wallet,txout);
              if (iVar4 != ISMINE_NO) {
                bVar2 = ExtractDestination(&txout->scriptPubKey,(CTxDestination *)&local_b8._M_first
                                          );
                if (bVar2) {
                  local_c8 = uVar10 - 1;
                  local_e8 = p_Var11[1]._M_nxt;
                  p_Stack_e0 = p_Var11[2]._M_nxt;
                  local_d8 = p_Var11[3]._M_nxt;
                  p_Stack_d0 = p_Var11[4]._M_nxt;
                  bVar2 = CWallet::IsSpent(wallet,(COutPoint *)&local_e8);
                  CVar5 = txout->nValue;
                  pmVar7 = std::
                           map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
                           ::operator[](__return_storage_ptr__,(key_type *)&local_b8._M_first);
                  if (bVar2) {
                    CVar5 = 0;
                  }
                  *pmVar7 = *pmVar7 + CVar5;
                }
              }
              std::__detail::__variant::
              _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                   *)&local_b8._M_first);
              uVar8 = (ulong)uVar10;
              p_Var6 = p_Var11[0x38]._M_nxt[3]._M_nxt;
              uVar9 = ((long)p_Var11[0x38]._M_nxt[4]._M_nxt - (long)p_Var6 >> 3) *
                      -0x3333333333333333;
              uVar10 = uVar10 + 1;
            } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
          }
        }
      }
    }
  }
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::map<CTxDestination, CAmount> GetAddressBalances(const CWallet& wallet)
{
    std::map<CTxDestination, CAmount> balances;

    {
        LOCK(wallet.cs_wallet);
        std::set<uint256> trusted_parents;
        for (const auto& walletEntry : wallet.mapWallet)
        {
            const CWalletTx& wtx = walletEntry.second;

            if (!CachedTxIsTrusted(wallet, wtx, trusted_parents))
                continue;

            if (wallet.IsTxImmatureCoinBase(wtx))
                continue;

            int nDepth = wallet.GetTxDepthInMainChain(wtx);
            if (nDepth < (CachedTxIsFromMe(wallet, wtx, ISMINE_ALL) ? 0 : 1))
                continue;

            for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
                const auto& output = wtx.tx->vout[i];
                CTxDestination addr;
                if (!wallet.IsMine(output))
                    continue;
                if(!ExtractDestination(output.scriptPubKey, addr))
                    continue;

                CAmount n = wallet.IsSpent(COutPoint(Txid::FromUint256(walletEntry.first), i)) ? 0 : output.nValue;
                balances[addr] += n;
            }
        }
    }

    return balances;
}